

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

GPU_Target *
GPU_InitRendererByID(GPU_RendererID renderer_request,Uint16 w,Uint16 h,GPU_WindowFlagEnum SDL_flags)

{
  GPU_RendererID id;
  GPU_RendererID id_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Bool _Var5;
  GPU_Renderer *pGVar6;
  GPU_Target *pGVar7;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffd0;
  
  gpu_init_error_queue();
  gpu_init_renderer_register();
  _Var5 = gpu_init_SDL();
  if ((_Var5) &&
     (id_00.renderer = (int)unaff_RBX, id_00.major_version = (int)((ulong)unaff_RBX >> 0x20),
     id_00.name = (char *)in_stack_ffffffffffffffd0, id_00._16_8_ = unaff_R12,
     pGVar6 = gpu_create_and_add_renderer(id_00), pGVar6 != (GPU_Renderer *)0x0)) {
    uVar1 = (pGVar6->id).renderer;
    uVar2 = (pGVar6->id).major_version;
    uVar3 = (pGVar6->id).minor_version;
    uVar4 = *(undefined4 *)&(pGVar6->id).field_0x14;
    id.major_version = uVar4;
    id.renderer = uVar3;
    id.name._4_4_ = uVar2;
    id.name._0_4_ = uVar1;
    id._16_8_ = in_stack_ffffffffffffffb0;
    _gpu_current_renderer = GPU_GetRenderer(id);
    if (_gpu_current_renderer != (GPU_Renderer *)0x0) {
      (*_gpu_current_renderer->impl->SetAsCurrent)(_gpu_current_renderer);
    }
    pGVar7 = (*pGVar6->impl->Init)(pGVar6,renderer_request,w,h,SDL_flags);
    if (pGVar7 != (GPU_Target *)0x0) {
      _gpu_init_windowID = 0;
      return pGVar7;
    }
    GPU_PushErrorCode("GPU_InitRendererByID",GPU_ERROR_BACKEND_ERROR,
                      "Renderer %s failed to initialize properly",(pGVar6->id).name);
    _gpu_num_window_mappings = 0;
    if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
      _gpu_num_window_mappings = 0;
      return (GPU_Target *)0x0;
    }
    (*_gpu_current_renderer->impl->Quit)(_gpu_current_renderer);
    GPU_FreeRenderer(_gpu_current_renderer);
  }
  return (GPU_Target *)0x0;
}

Assistant:

GPU_Target* GPU_InitRendererByID(GPU_RendererID renderer_request, Uint16 w, Uint16 h, GPU_WindowFlagEnum SDL_flags)
{
    GPU_Renderer* renderer;
    GPU_Target* screen;

    gpu_init_error_queue();
    gpu_init_renderer_register();

    if(!gpu_init_SDL())
        return NULL;

    renderer = gpu_create_and_add_renderer(renderer_request);
    if(renderer == NULL)
        return NULL;

    GPU_SetCurrentRenderer(renderer->id);

    screen = renderer->impl->Init(renderer, renderer_request, w, h, SDL_flags);
    if(screen == NULL)
    {
        GPU_PushErrorCode("GPU_InitRendererByID", GPU_ERROR_BACKEND_ERROR, "Renderer %s failed to initialize properly", renderer->id.name);
        // Init failed, destroy the renderer...
        // Erase the window mappings
        _gpu_num_window_mappings = 0;
        GPU_CloseCurrentRenderer();
    }
    else
        GPU_SetInitWindow(0);
    return screen;
}